

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

void HTS_error(int error,char *message,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *__ptr;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t sStack_f0;
  va_list arg;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  fflush(_stdout);
  fflush(_stderr);
  if (error < 1) {
    __ptr = "\nWarning: ";
    sStack_f0 = 10;
  }
  else {
    __ptr = "\nError: ";
    sStack_f0 = 8;
  }
  fwrite(__ptr,sStack_f0,1,_stderr);
  arg[0].reg_save_area = local_c8;
  arg[0].overflow_arg_area = &stack0x00000008;
  arg[0].gp_offset = 0x10;
  arg[0].fp_offset = 0x30;
  vfprintf(_stderr,message,arg);
  fflush(_stderr);
  if (error < 1) {
    return;
  }
  exit(error);
}

Assistant:

void HTS_error(int error, const char *message, ...)
{
   va_list arg;

   fflush(stdout);
   fflush(stderr);

   if (error > 0)
      fprintf(stderr, "\nError: ");
   else
      fprintf(stderr, "\nWarning: ");

   va_start(arg, message);
   vfprintf(stderr, message, arg);
   va_end(arg);

   fflush(stderr);

   if (error > 0)
      exit(error);
}